

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

uint fl_utf8froma(char *dst,uint dstlen,char *src,uint srclen)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  
  pbVar3 = (byte *)(src + srclen);
  if (dstlen == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = 0;
    do {
      while( true ) {
        pbVar4 = (byte *)src;
        if (pbVar3 <= pbVar4) {
          dst[uVar1] = '\0';
          return uVar1;
        }
        bVar5 = *pbVar4;
        src = (char *)(pbVar4 + 1);
        if (-1 < (char)bVar5) break;
        uVar2 = uVar1 + 2;
        if (dstlen <= uVar2) {
          dst[uVar1] = '\0';
          goto LAB_001f74ac;
        }
        dst[uVar1] = bVar5 >> 6 | 0xc0;
        dst[uVar1 + 1] = bVar5 & 0xbf;
        uVar1 = uVar2;
      }
      uVar2 = uVar1 + 1;
      if (uVar2 >= dstlen) {
        bVar5 = 0;
      }
      dst[uVar1] = bVar5;
      uVar1 = uVar2;
    } while (uVar2 < dstlen);
LAB_001f74ac:
    src = (char *)(pbVar4 + 1);
  }
  for (; src < pbVar3; src = (char *)((byte *)src + 1)) {
    uVar2 = uVar2 + ((byte)*src >> 7) + 1;
  }
  return uVar2;
}

Assistant:

unsigned fl_utf8froma(char* dst, unsigned dstlen,
		   const char* src, unsigned srclen) {
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char ucs;
    if (p >= e) {dst[count] = 0; return count;}
    ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else { /* 2 bytes (note that CP1252 translate could make 3 bytes!) */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    unsigned char ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      count++;
    } else {
      count += 2;
    }
  }
  return count;
}